

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

void tinyformat::detail::formatTruncated<unsigned_long>
               (ostream *out,unsigned_long *value,int ntrunc)

{
  long in_FS_OFFSET;
  string result;
  ostringstream tmp;
  long *local_1c0;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  std::ostream::write((char *)out,(long)local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void formatTruncated(std::ostream& out, const T& value, int ntrunc)
{
    std::ostringstream tmp;
    tmp << value;
    std::string result = tmp.str();
    out.write(result.c_str(), (std::min)(ntrunc, static_cast<int>(result.size())));
}